

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readChunkHeader(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  char cVar1;
  uint uVar2;
  PromiseArenaMember *node;
  SourceLocation location;
  undefined8 *puVar3;
  coroutine_handle<void> coroutine;
  None *pNVar4;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *pMVar5;
  ulong uVar6;
  long in_RSI;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *pMVar7;
  int iVar8;
  uint uVar9;
  FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *value;
  bool bVar10;
  Fault f;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  Fault local_70;
  undefined8 *local_68;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  local_60;
  PromiseBase local_38;
  
  coroutine._M_fr_ptr = operator_new(0x580);
  *(code **)coroutine._M_fr_ptr = readChunkHeader;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readChunkHeader;
  this_00 = (Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)coroutine._M_fr_ptr + 0x10);
  local_60.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)0x4f0126;
  local_60.right = (None *)0x4f15bd;
  local_60.op.content.ptr = (char *)0x400000060a;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0061d740;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0061d788;
  location.function = "readChunkHeader";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x60a;
  location.columnNumber = 0x40;
  local_68 = (undefined8 *)coroutine._M_fr_ptr;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  puVar3 = local_68;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0061d740;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0061d788;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  local_60.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0xd8);
  bVar10 = *(long *)(in_RSI + 0xe0) == 0;
  local_60.right = (None *)&none;
  local_60.op.content.ptr = " != ";
  local_60.op.content.size_ = 5;
  local_60.result = !bVar10;
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  if (bVar10) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x60b,FAILED,"onMessageDone != kj::none","_kjCondition,",&local_60);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x570);
  readHeader(this_01,(HeaderType)in_RSI,1,*(size_t *)(in_RSI + 0x30));
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)coroutine._M_fr_ptr + 0x278);
  co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
  *(undefined1 *)(puVar3 + 0xaf) = 0;
  bVar10 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                     ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (bVar10) {
    return (Promise<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>)
           (PromiseNode *)local_38.node.ptr;
  }
  kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
  await_resume((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
               ((long)coroutine._M_fr_ptr + 0x470),__return_storage_ptr__);
  if ((*(char *)(puVar3 + 0x85) == '\x01') && (*(int *)(puVar3 + 0x86) - 1U < 2)) {
    *(undefined4 *)(puVar3 + 0x86) = 0;
  }
  if (*(char *)(puVar3 + 0x52) == '\x01') {
    Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x298));
  }
  kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
  node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
  if (node != (PromiseArenaMember *)0x0) {
    (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  uVar2 = ((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
          ((long)coroutine._M_fr_ptr + 0x470))->tag;
  if (uVar2 != 1) {
    if (uVar2 != 2) {
      kj::_::unreachable();
    }
    value = (FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)coroutine._M_fr_ptr + 0x4b0);
    *(undefined4 *)(puVar3 + 0x96) = 2;
    puVar3[0x97] = puVar3[0x8f];
    puVar3[0x98] = puVar3[0x90];
    puVar3[0x99] = puVar3[0x91];
    puVar3[0x9a] = puVar3[0x92];
    puVar3[0x9b] = puVar3[0x93];
    puVar3[0x9c] = puVar3[0x94];
    puVar3[0x9d] = puVar3[0x95];
    kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::fulfill
              (this_00,value);
    goto LAB_00397860;
  }
  pNVar4 = (None *)puVar3[0x90];
  local_60.right = (None *)((ulong)local_60.right & 0xffffffff00000000);
  local_60.op.content.ptr = " > ";
  local_60.op.content.size_ = 4;
  local_60.result = pNVar4 != (None *)0x0;
  local_60.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)pNVar4;
  if (pNVar4 == (None *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x615,FAILED,"text.size() > 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)&local_60);
    kj::_::Debug::Fault::~Fault(&local_70);
    pNVar4 = (None *)puVar3[0x90];
    if (pNVar4 != (None *)0x0) {
      pMVar5 = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)puVar3[0x8f];
      goto LAB_003977e2;
    }
    uVar6 = 0;
  }
  else {
    pMVar5 = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
             ((ArrayPtr<char> *)((long)coroutine._M_fr_ptr + 0x478))->ptr;
LAB_003977e2:
    value = (FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)coroutine._M_fr_ptr + 0x4f0);
    uVar6 = 0;
    pMVar7 = pMVar5;
    do {
      cVar1 = *(char *)&(pMVar7->ptr).disposer;
      iVar8 = (int)cVar1;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar6 = uVar6 << 4 | (ulong)(iVar8 - 0x30);
      }
      else {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          uVar9 = iVar8 - 0x57;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) {
            local_60.left = pMVar5;
            local_60.right = pNVar4;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,char_const(&)[24],kj::ArrayPtr<char>&,kj::ArrayPtr<unsigned_char>>
                      (&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0x620,FAILED,(char *)0x0,"\"invalid HTTP chunk size\", text, text.asBytes()"
                       ,(char (*) [24])"invalid HTTP chunk size",
                       (ArrayPtr<char> *)((long)coroutine._M_fr_ptr + 0x478),
                       (ArrayPtr<unsigned_char> *)&local_60);
            kj::_::Debug::Fault::~Fault(&local_70);
            *(undefined4 *)(puVar3 + 0x9e) = 1;
            puVar3[0x9f] = uVar6;
            kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::fulfill
                      (this_00,value);
            uVar2 = value->tag;
            goto LAB_00397866;
          }
          uVar9 = iVar8 - 0x37;
        }
        uVar6 = uVar6 * 0x10 + (ulong)uVar9;
      }
      pMVar7 = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
               ((long)&(pMVar7->ptr).disposer + 1);
    } while ((None *)pMVar7 != pNVar4 + (long)&pMVar5->ptr);
  }
  value = (FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
          ((long)coroutine._M_fr_ptr + 0x530);
  *(undefined4 *)(puVar3 + 0xa6) = 1;
  puVar3[0xa7] = uVar6;
  kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::fulfill
            (this_00,value);
LAB_00397860:
  uVar2 = value->tag;
LAB_00397866:
  if (uVar2 - 1 < 2) {
    value->tag = 0;
  }
  *puVar3 = 0;
  *(undefined1 *)(puVar3 + 0xaf) = 1;
  return (Promise<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>)
         (PromiseNode *)local_38.node.ptr;
}

Assistant:

kj::Promise<kj::OneOf<uint64_t, HttpHeaders::ProtocolError>> readChunkHeader() {
    KJ_REQUIRE(onMessageDone != kj::none);

    // We use the portion of the header after the end of message headers.
    auto textOrError = co_await readHeader(HeaderType::CHUNK, messageHeaderEnd, messageHeaderEnd);

    KJ_SWITCH_ONEOF(textOrError) {
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        co_return protocolError;
      }
      KJ_CASE_ONEOF(text, kj::ArrayPtr<char>) {
        KJ_REQUIRE(text.size() > 0) { break; }

        uint64_t value = 0;
        for (char c: text) {
          if ('0' <= c && c <= '9') {
            value = value * 16 + (c - '0');
          } else if ('a' <= c && c <= 'f') {
            value = value * 16 + (c - 'a' + 10);
          } else if ('A' <= c && c <= 'F') {
            value = value * 16 + (c - 'A' + 10);
          } else {
            KJ_FAIL_REQUIRE("invalid HTTP chunk size", text, text.asBytes()) { break; }
            co_return value;
          }
        }

        co_return value;
      }
    }

    KJ_UNREACHABLE;
  }